

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  pointer pcVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  local_20._M_len = uVar2;
  local_20._M_str = pcVar3;
  if (3 < uVar2) {
    __str._M_str = "/bin";
    __str._M_len = 4;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_20,uVar2 - 4,4,__str);
    if (iVar1 == 0) {
LAB_003badd5:
      cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
      return __return_storage_ptr__;
    }
    pcVar3 = (s->_M_dataplus)._M_p;
    uVar2 = s->_M_string_length;
    local_20._M_len = uVar2;
    local_20._M_str = pcVar3;
    if (4 < uVar2) {
      __str_00._M_str = "/sbin";
      __str_00._M_len = 5;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_20,uVar2 - 5,5,__str_00);
      if (iVar1 == 0) goto LAB_003badd5;
      pcVar3 = (s->_M_dataplus)._M_p;
      uVar2 = s->_M_string_length;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar3 + uVar2);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}